

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

int is_builtin(char *key,int keylen)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  do {
    iVar1 = strncmp(key,*(char **)((long)is_builtin::builtins + lVar2),(long)keylen);
    if (iVar1 == 0) break;
    bVar3 = lVar2 != 0x120;
    lVar2 = lVar2 + 8;
  } while (bVar3);
  return (int)(iVar1 == 0);
}

Assistant:

static int is_builtin(char *key, int keylen)
{
	static char *builtins[] = {"alloca",
				   "int64_t",
				   "lua_Number",
				   "lua_Integer",
				   "TValue",
				   "ivalue",
				   "setivalue",
				   "fvalue",
				   "setfltvalue",
				   "Ravi_Arr",
				   "arrvalue",
				   "ttisfulluserdata",
				   "ttislightuserdata",
				   "ttisstring",
				   "uvalue",
				   "pvalue",
				   "svalue",
				   "getudatamem",
				   "gco2u",
				   "sizeudata",
				   "vslen",
				   "R",
				   "Ravi_StringOrUserData",
				   "Ravi_IntegerArray",
				   "Ravi_NumberArray",
				   "raviX__error_code",
				   "LUA_TBOOLEAN",
				   "LUA_TNIL",
				   "LUA_TNUMBER",
				   "LUA_TUSERDATA",
				   "LUA_TLIGHTUSERDATA",
				   "LUA_TTHREAD",
				   "LUA_TTABLE",
				   "LUA_TFUNCTION",
				   "LUA_TSTRING",
				   "LUA_TTABLE",
				   "settt_",
				   NULL};
	for (int i = 0; builtins[i]; i++) {
		if (strncmp(key, builtins[i], keylen) == 0) {
			return 1;
		}
	}
	return 0;
}